

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_ssls.c
# Opt level: O2

CURLcode tool_ssls_exp(CURL *easy,void *userptr,char *session_key,uchar *shmac,size_t shmac_len,
                      uchar *sdata,size_t sdata_len,curl_off_t valid_until,int ietf_tls_id,
                      char *alpn,size_t earlydata_max)

{
  CURLcode CVar1;
  size_t sVar2;
  CURLcode CVar3;
  int iVar4;
  size_t sVar5;
  char *enc;
  size_t enc_len;
  
  enc = (char *)0x0;
  if (*(int *)((long)userptr + 0x10) == 0) {
    fputs("# Your SSL session cache. https://curl.se/docs/ssl-sessions.html\n# This file was generated by libcurl! Edit at your own risk.\n"
          ,*(FILE **)((long)userptr + 8));
  }
  CVar3 = curlx_base64_encode((char *)shmac,shmac_len,&enc,&enc_len);
  sVar2 = enc_len;
  if (CVar3 == CURLE_OK) {
    sVar5 = fwrite(enc,1,enc_len,*(FILE **)((long)userptr + 8));
    CVar1 = CURLE_WRITE_ERROR;
    CVar3 = CVar1;
    if ((sVar2 == sVar5) && (iVar4 = fputc(0x3a,*(FILE **)((long)userptr + 8)), iVar4 != -1)) {
      curl_free(enc);
      CVar3 = curlx_base64_encode((char *)sdata,sdata_len,&enc,&enc_len);
      if ((CVar3 == CURLE_OK) &&
         ((sVar5 = fwrite(enc,1,enc_len,*(FILE **)((long)userptr + 8)), CVar3 = CVar1,
          enc_len == sVar5 && (iVar4 = fputc(10,*(FILE **)((long)userptr + 8)), iVar4 != -1)))) {
        *(int *)((long)userptr + 0x10) = *(int *)((long)userptr + 0x10) + 1;
        CVar3 = CURLE_OK;
        goto LAB_0011c943;
      }
    }
  }
  warnf(*userptr,"Warning: error saving SSL session for \'%s\': %d",session_key,(ulong)CVar3);
LAB_0011c943:
  curl_free(enc);
  return CVar3;
}

Assistant:

static CURLcode tool_ssls_exp(CURL *easy, void *userptr,
                              const char *session_key,
                              const unsigned char *shmac, size_t shmac_len,
                              const unsigned char *sdata, size_t sdata_len,
                              curl_off_t valid_until, int ietf_tls_id,
                              const char *alpn, size_t earlydata_max)
{
  struct tool_ssls_ctx *ctx = userptr;
  char *enc = NULL;
  size_t enc_len;
  CURLcode r;

  (void)easy;
  (void)valid_until;
  (void)ietf_tls_id;
  (void)alpn;
  (void)earlydata_max;
  if(!ctx->exported)
    fputs("# Your SSL session cache. https://curl.se/docs/ssl-sessions.html\n"
        "# This file was generated by libcurl! Edit at your own risk.\n",
        ctx->fp);

  r = curlx_base64_encode((const char *)shmac, shmac_len, &enc, &enc_len);
  if(r)
    goto out;
  r = CURLE_WRITE_ERROR;
  if(enc_len != fwrite(enc, 1, enc_len, ctx->fp))
    goto out;
  if(EOF == fputc(':', ctx->fp))
    goto out;
  curl_free(enc);
  r = curlx_base64_encode((const char *)sdata, sdata_len, &enc, &enc_len);
  if(r)
    goto out;
  r = CURLE_WRITE_ERROR;
  if(enc_len != fwrite(enc, 1, enc_len, ctx->fp))
    goto out;
  if(EOF == fputc('\n', ctx->fp))
    goto out;
  r = CURLE_OK;
  ctx->exported++;
out:
  if(r)
    warnf(ctx->global, "Warning: error saving SSL session for '%s': %d",
          session_key, r);
  curl_free(enc);
  return r;
}